

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_chk2cmp2_8_pcdi(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  bool local_25;
  uint local_24;
  bool local_1e;
  bool local_1d;
  sint upper_bound;
  sint lower_bound;
  uint ea;
  sint compare;
  uint word2;
  
  if ((m68ki_cpu.cpu_type & 0x3f8) == 0) {
    m68ki_exception_illegal();
  }
  else {
    uVar2 = m68ki_read_imm_16();
    uVar1 = m68ki_cpu.dar[uVar2 >> 0xc & 0xf];
    lower_bound = uVar1 & 0xff;
    uVar3 = m68ki_get_ea_pcdi();
    uVar4 = m68ki_read_8_fc(uVar3,m68ki_cpu.s_flag | 2);
    uVar3 = m68ki_read_8_fc(uVar3 + 1,m68ki_cpu.s_flag | 2);
    if ((uVar2 & 0x8000) == 0) {
      lower_bound = (sint)(char)uVar1;
    }
    local_1d = uVar3 == lower_bound || uVar4 == lower_bound;
    m68ki_cpu.not_z_flag = (uint)((local_1d ^ 0xffU) & 1);
    if ((int)uVar3 < (int)uVar4) {
      local_25 = (int)uVar3 < lower_bound || lower_bound < (int)uVar4;
      local_1e = local_25;
    }
    else {
      local_1e = lower_bound < (int)uVar4 || (int)uVar3 < lower_bound;
    }
    local_24 = (uint)local_1e;
    m68ki_cpu.c_flag = local_24 << 8;
    if ((local_24 != 0) && ((uVar2 & 0x800) != 0)) {
      m68ki_exception_trap(6);
    }
  }
  return;
}

Assistant:

static void m68k_op_chk2cmp2_8_pcdi(void)
{
	if(CPU_TYPE_IS_EC020_PLUS(CPU_TYPE))
	{
		uint word2 = OPER_I_16();
		sint compare = REG_DA[(word2 >> 12) & 15]&0xff;
		uint ea = EA_PCDI_8();
		sint lower_bound = m68ki_read_pcrel_8(ea);
		sint upper_bound = m68ki_read_pcrel_8(ea + 1);

		if(!BIT_F(word2))
			compare = (int32)(int8)compare;
      
		FLAG_Z = !((upper_bound==compare) || (lower_bound==compare));  // JFF: | => ||

    FLAG_C = (lower_bound <= upper_bound ? compare < lower_bound || compare > upper_bound : compare > upper_bound || compare < lower_bound) << 8;

		if(COND_CS() && BIT_B(word2))
				m68ki_exception_trap(EXCEPTION_CHK);
		return;
	}

      
	m68ki_exception_illegal();
}